

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O2

Value * __thiscall
kj::_::Debug::
ContextImpl<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/table-test.c++:815:7)>
::evaluate(Value *__return_storage_ptr__,
          ContextImpl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_table_test_c__:815:7)>
          *this)

{
  StringPtr *in_RCX;
  Array<char> local_28;
  
  makeDescription<unsigned_int&>((String *)&local_28,(Debug *)0x195d0b,(char *)this->func->i,in_RCX)
  ;
  __return_storage_ptr__->file =
       "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/table-test.c++"
  ;
  __return_storage_ptr__->line = 0x32f;
  (__return_storage_ptr__->description).content.ptr = local_28.ptr;
  (__return_storage_ptr__->description).content.size_ = local_28.size_;
  (__return_storage_ptr__->description).content.disposer = local_28.disposer;
  local_28.ptr = (char *)0x0;
  local_28.size_ = 0;
  Array<char>::~Array(&local_28);
  return __return_storage_ptr__;
}

Assistant:

Value evaluate() override {
      return func();
    }